

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_test.c
# Opt level: O1

_Bool stack_test(void)

{
  byte bVar1;
  _Bool _Var2;
  int32 iVar3;
  uint32 uVar4;
  int64 iVar5;
  uint64 uVar6;
  float32 fVar7;
  float64 fVar8;
  stack stack1;
  stack local_50;
  
  initStack(&local_50);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushF64(&local_50,42343243.234234236);
  pushBool(&local_50,false);
  pushU32(&local_50,0x159);
  pushS32(&local_50,-0xd89);
  pushU64(&local_50,0x80a778cc1);
  pushS64(&local_50,-0x38c2f8803a);
  pushF32(&local_50,2323.535);
  pushF64(&local_50,42343243.234234236);
  pushByte(&local_50,0xc9);
  bVar1 = popByte(&local_50);
  fVar8 = popF64(&local_50);
  fVar7 = popF32(&local_50);
  iVar5 = popS64(&local_50);
  uVar6 = popU64(&local_50);
  iVar3 = popS32(&local_50);
  uVar4 = popU32(&local_50);
  _Var2 = popBool(&local_50);
  return (_Bool)(~_Var2 & uVar4 == 0x159 & (uVar6 == 0x80a778cc1 && iVar3 == -0xd89) &
                 iVar5 == -0x38c2f8803a & (float)fVar7 == 2323.535 &
                (bVar1 == 0xc9 && (double)fVar8 == 42343243.234234236));
}

Assistant:

bool stack_test() {
    stack stack1;
    initStack(&stack1);
    stack *s = &stack1;
    bool a, a_ = false;
    uint32 b, b_ = 345;
    int32 c, c_ = -3465;
    uint64 d, d_ = 34535345345;
    int64 e, e_ = -243789234234;
    float32 f, f_ = 2323.535;
    byte h, h_ = 201;
    float64 g, g_ = 42343243.234234234;
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushF64(s, g_);
    pushBool(s, a_);
    pushU32(s, b_);
    pushS32(s, c_);
    pushU64(s, d_);
    pushS64(s, e_);
    pushF32(s, f_);
    pushF64(s, g_);
    pushByte(s, h_);
    h = popByte(s);
    g = popF64(s);
    f = popF32(s);
    e = popS64(s);
    d = popU64(s);
    c = popS32(s);
    b = popU32(s);
    a = popBool(s);
    if (a == a_)
        if (b == b_)
            if (c == c_)
                if (d == d_)
                    if (e == e_)
                        if (f == f_)
                            if (g == g_)
                                if (h == h_)
                                    return true;
    return false;
}